

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O3

ErrorType __thiscall Network::Client::MQTTv5::eventLoop(MQTTv5 *this)

{
  Impl *this_00;
  int iVar1;
  ErrorType EVar2;
  ErrorType EVar3;
  time_t tVar4;
  ErrorType EVar5;
  Impl *pIVar6;
  PingRespPacket rpacket;
  PingReqPacket packet;
  Serializable local_48;
  undefined **local_40;
  undefined1 local_38;
  ControlPacketSerializable local_30;
  undefined **local_28;
  undefined1 local_20;
  
  pIVar6 = this->impl;
  if (pIVar6->socket == (BaseSocket *)0x0) {
    return (ErrorType)-7;
  }
  if (((pIVar6->super_ImplBase<Network::Client::MQTTv5::Impl>).recvState != GotCompletePacket) ||
     ((pIVar6->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers.buffer
      [(ulong)(pIVar6->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers.maxID * 4] < 0x10)) {
    tVar4 = time((time_t *)0x0);
    this_00 = this->impl;
    if ((uint)(pIVar6->super_ImplBase<Network::Client::MQTTv5::Impl>).keepAlive <=
        (int)tVar4 - (pIVar6->super_ImplBase<Network::Client::MQTTv5::Impl>).lastCommunication) {
      (this_00->super_ImplBase<Network::Client::MQTTv5::Impl>).state = Pinging;
      local_20 = 0xc0;
      local_28 = &PTR_getType_0012ef78;
      local_30.super_Serializable._vptr_Serializable = (Serializable)&PTR_getSize_0012ef00;
      EVar2 = ImplBase<Network::Client::MQTTv5::Impl>::requestOneLoop
                        (&this_00->super_ImplBase<Network::Client::MQTTv5::Impl>,&local_30);
      if (EVar2.errorCode != 0) {
        return (ErrorType)EVar2.errorCode;
      }
      pIVar6 = this->impl;
      if ((pIVar6->super_ImplBase<Network::Client::MQTTv5::Impl>).recvState != GotCompletePacket) {
        return (ErrorType)0;
      }
      if (((pIVar6->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers.buffer
           [(ulong)(pIVar6->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers.maxID * 4] & 0xf0
          ) != 0xd0) {
        return (ErrorType)0;
      }
      local_38 = 0xd0;
      local_40 = &PTR_getType_0012f040;
      local_48._vptr_Serializable = (_func_int **)&PTR_getSize_0012efe0;
      iVar1 = ImplBase<Network::Client::MQTTv5::Impl>::extractControlPacket
                        (&pIVar6->super_ImplBase<Network::Client::MQTTv5::Impl>,PINGRESP,&local_48);
      if (iVar1 < 1) {
        return (ErrorType)-6;
      }
      return (ErrorType)0;
    }
    iVar1 = ImplBase<Network::Client::MQTTv5::Impl>::receiveControlPacket
                      (&this_00->super_ImplBase<Network::Client::MQTTv5::Impl>,true);
    if (iVar1 == -2) {
      return (ErrorType)0;
    }
    if (iVar1 == 0) {
      ImplBase<Network::Client::MQTTv5::Impl>::close
                (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,0x80);
      return (ErrorType)-7;
    }
    if (iVar1 < 0) {
      return (ErrorType)-6;
    }
    pIVar6 = this->impl;
  }
  EVar3 = ImplBase<Network::Client::MQTTv5::Impl>::dealWithNoise
                    (&pIVar6->super_ImplBase<Network::Client::MQTTv5::Impl>);
  EVar5.errorCode = 0;
  if (EVar3.errorCode != -8) {
    EVar5 = EVar3;
  }
  return (ErrorType)EVar5.errorCode;
}

Assistant:

MQTTv5::ErrorType MQTTv5::eventLoop()
    {
        if (!impl->isOpen()) return ErrorType::NotConnected;

        // Check if we have a packet ready for reading now
        Protocol::MQTT::Common::ControlPacketType type = impl->getLastPacketType();
        if (type == Protocol::MQTT::V5::RESERVED)
        {
            // Check if we need to ping the server
            if (impl->shouldPing())
            {
                // Create a Ping request packet and send it
                impl->setConnectionState(State::Pinging);
                Protocol::MQTT::V5::PingReqPacket packet;
                if (ErrorType ret = impl->requestOneLoop(packet))
                    return ret;

                type = impl->getLastPacketType();
                if (type == Protocol::MQTT::V5::PINGRESP)
                {
                    Protocol::MQTT::V5::PingRespPacket rpacket;
                    int ret = impl->extractControlPacket(type, rpacket);
                    if (ret <= 0) return ErrorType::NetworkError;
                }
                // Ok, done for now
                return ErrorType::Success;
            }
            // Check the server for any packet...
            int ret = impl->receiveControlPacket(true);
            if (ret == 0)
            {
                impl->close();
                return ErrorType::NotConnected;
            }
            // No answer in time, it's not an error here
            if (ret == -2) return ErrorType::Success;
            if (ret < 0)   return ErrorType::NetworkError;
            // Ok, now we have a packet read it
            type = impl->getLastPacketType();
        }

        ErrorType ret = impl->dealWithNoise();
        if (ret == ErrorType::TranscientPacket)
            return ErrorType::Success;

        return ret;
    }